

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lockstep_scheduler_test.cpp
# Opt level: O0

void test_absolute_time(void)

{
  uint64_t uVar1;
  uint64_t in_stack_00000018;
  LockstepScheduler *in_stack_00000020;
  LockstepScheduler ls;
  LockstepScheduler *in_stack_ffffffffffffffa0;
  
  LockstepScheduler::LockstepScheduler(in_stack_ffffffffffffffa0);
  LockstepScheduler::set_absolute_time(in_stack_00000020,in_stack_00000018);
  uVar1 = LockstepScheduler::get_absolute_time((LockstepScheduler *)0x10f37e);
  if (uVar1 == 0xbc614e) {
    LockstepScheduler::~LockstepScheduler((LockstepScheduler *)0x10f3d7);
    return;
  }
  __assert_fail("ls.get_absolute_time() == some_time_us",
                "/workspace/llm4binary/github/license_all_cmakelists_25/julianoes[P]lockstep-scheduler/test/src/lockstep_scheduler_test.cpp"
                ,0xf,"void test_absolute_time()");
}

Assistant:

void test_absolute_time()
{
    LockstepScheduler ls;
    ls.set_absolute_time(some_time_us);
    assert(ls.get_absolute_time() == some_time_us);
}